

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

cio_error read_some_chunks(cio_io_stream *ios,cio_read_buffer *buffer,
                          cio_io_stream_read_handler_t handler,void *context)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_58;
  size_t local_50;
  size_t len_1;
  size_t len;
  size_t string_len;
  memory_stream *memory_stream;
  void *context_local;
  cio_io_stream_read_handler_t handler_local;
  cio_read_buffer *buffer_local;
  cio_io_stream *ios_local;
  
  sVar1 = strlen((char *)ios[1].read_some);
  if (read_some_fake.call_count == 1) {
    local_50 = sVar1 >> 1;
    sVar2 = cio_read_buffer_space_available(buffer);
    if (sVar2 < local_50) {
      local_50 = cio_read_buffer_space_available(buffer);
    }
    memcpy(buffer->add_ptr,ios[1].read_some,local_50);
    buffer->add_ptr = buffer->add_ptr + local_50;
    chunk_bytes_written = local_50 + chunk_bytes_written;
    (*handler)(ios,context,CIO_SUCCESS,buffer);
  }
  else {
    local_58 = sVar1 - chunk_bytes_written;
    sVar2 = cio_read_buffer_space_available(buffer);
    if (sVar2 < local_58) {
      local_58 = cio_read_buffer_space_available(buffer);
    }
    memcpy(buffer->add_ptr,ios[1].read_some + chunk_bytes_written,local_58);
    buffer->add_ptr = buffer->add_ptr + local_58;
    chunk_bytes_written = local_58 + chunk_bytes_written;
    (*handler)(ios,context,CIO_SUCCESS,buffer);
  }
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error read_some_chunks(struct cio_io_stream *ios, struct cio_read_buffer *buffer, cio_io_stream_read_handler_t handler, void *context)
{
	struct memory_stream *memory_stream = cio_container_of(ios, struct memory_stream, ios);
	size_t string_len = strlen(memory_stream->mem);
	if (read_some_fake.call_count == 1) {
		string_len = string_len / 2;
		size_t len = CIO_MIN(cio_read_buffer_space_available(buffer), string_len);
		memcpy(buffer->add_ptr, memory_stream->mem, len);
		buffer->add_ptr += len;
		chunk_bytes_written += len;
		handler(ios, context, CIO_SUCCESS, buffer);
	} else {
		string_len = string_len - chunk_bytes_written;
		size_t len = CIO_MIN(cio_read_buffer_space_available(buffer), string_len);
		memcpy(buffer->add_ptr, (uint8_t *)memory_stream->mem + chunk_bytes_written, len);
		buffer->add_ptr += len;
		chunk_bytes_written += len;
		handler(ios, context, CIO_SUCCESS, buffer);
	}

	return CIO_SUCCESS;
}